

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

bool __thiscall QHttp2Connection::sendClientPreface(QHttp2Connection *this)

{
  bool bVar1;
  QIODevice *this_00;
  char *file;
  long lVar2;
  QHttp2Connection *in_RDI;
  long in_FS_OFFSET;
  qint64 written;
  QIODevice *socket;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QHttp2Connection *this_01;
  bool local_49;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = getSocket((QHttp2Connection *)0x2b594a);
  file = (char *)QIODevice::write((char *)this_00,0x3ced20);
  if (file == (char *)0x18) {
    bVar1 = sendSETTINGS(this_01);
    if (bVar1) {
      in_RDI->m_prefaceSent = true;
      lVar2 = (**(code **)(*(long *)this_00 + 0xa0))();
      if (lVar2 != 0) {
        QMetaObject::invokeMethod<void(QHttp2Connection::*)()>
                  (this_01,(offset_in_QHttp2Connection_to_subr *)this_00,
                   (ConnectionType)((ulong)file >> 0x20));
      }
      local_49 = true;
    }
    else {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      qHttp2ConnectionLog();
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
                 (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_18);
        if (!bVar1) break;
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2b59d2);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,file,(int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                   (char *)0x2b59e8);
        QMessageLogger::warning(local_38,"[%p] Failed to send SETTINGS",in_RDI);
        local_10 = local_10 & 0xffffffffffffff00;
      }
      local_49 = false;
    }
  }
  else {
    local_49 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendClientPreface()
{
    QIODevice *socket = getSocket();
    // 3.5 HTTP/2 Connection Preface
    const qint64 written = socket->write(Http2clientPreface, clientPrefaceLength);
    if (written != clientPrefaceLength)
        return false;

    if (!sendSETTINGS()) {
        qCWarning(qHttp2ConnectionLog, "[%p] Failed to send SETTINGS", this);
        return false;
    }
    m_prefaceSent = true;
    if (socket->bytesAvailable()) // We ignore incoming data until preface is sent, so handle it now
        QMetaObject::invokeMethod(this, &QHttp2Connection::handleReadyRead, Qt::QueuedConnection);
    return true;
}